

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.h
# Opt level: O0

void __thiscall cmCTestUploadCommand::~cmCTestUploadCommand(cmCTestUploadCommand *this)

{
  cmCTestUploadCommand *this_local;
  
  ~cmCTestUploadCommand(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

cmCTestUploadCommand() {}